

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::ConvertMaterialForMesh
          (FBXConverter *this,aiMesh *out,Model *model,MeshGeometry *geo,
          value_type_conflict2 materialIndex)

{
  pointer ppMVar1;
  uint uVar2;
  iterator iVar3;
  mapped_type_conflict2 *pmVar4;
  Material *mat;
  Material *local_38;
  
  if (-1 < materialIndex) {
    ppMVar1 = (model->materials).
              super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(uint)materialIndex <
        (ulong)((long)(model->materials).
                      super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3)) {
      local_38 = ppMVar1[(uint)materialIndex];
      iVar3 = std::
              _Rb_tree<const_Assimp::FBX::Material_*,_std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>,_std::_Select1st<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>,_std::less<const_Assimp::FBX::Material_*>,_std::allocator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>_>
              ::find(&(this->materials_converted)._M_t,&local_38);
      if ((_Rb_tree_header *)iVar3._M_node ==
          &(this->materials_converted)._M_t._M_impl.super__Rb_tree_header) {
        uVar2 = ConvertMaterial(this,local_38,geo);
        out->mMaterialIndex = uVar2;
        pmVar4 = std::
                 map<const_Assimp::FBX::Material_*,_unsigned_int,_std::less<const_Assimp::FBX::Material_*>,_std::allocator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>_>
                 ::operator[](&this->materials_converted,&local_38);
        *pmVar4 = uVar2;
        return;
      }
      uVar2 = *(uint *)&iVar3._M_node[1]._M_parent;
      goto LAB_0050a7d2;
    }
  }
  LogFunctions<Assimp::FBXImporter>::LogError((char *)0x50a7ca);
  uVar2 = GetDefaultMaterial(this);
LAB_0050a7d2:
  out->mMaterialIndex = uVar2;
  return;
}

Assistant:

void FBXConverter::ConvertMaterialForMesh(aiMesh* out, const Model& model, const MeshGeometry& geo,
            MatIndexArray::value_type materialIndex)
        {
            // locate source materials for this mesh
            const std::vector<const Material*>& mats = model.GetMaterials();
            if (static_cast<unsigned int>(materialIndex) >= mats.size() || materialIndex < 0) {
                FBXImporter::LogError("material index out of bounds, setting default material");
                out->mMaterialIndex = GetDefaultMaterial();
                return;
            }

            const Material* const mat = mats[materialIndex];
            MaterialMap::const_iterator it = materials_converted.find(mat);
            if (it != materials_converted.end()) {
                out->mMaterialIndex = (*it).second;
                return;
            }

            out->mMaterialIndex = ConvertMaterial(*mat, &geo);
            materials_converted[mat] = out->mMaterialIndex;
        }